

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O2

void __thiscall
IRT::BlockFormerVisitor::Visit(BlockFormerVisitor *this,JumpStatement *jump_statement)

{
  JumpStatement *this_00;
  Label LStack_38;
  
  this->block_finished_ = true;
  this_00 = (JumpStatement *)operator_new(0x28);
  std::__cxx11::string::string((string *)&LStack_38,(string *)&jump_statement->label_);
  JumpStatement::JumpStatement(this_00,&LStack_38);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.statement_ = (Statement *)this_00;
  std::__cxx11::string::~string((string *)&LStack_38);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(JumpStatement* jump_statement) {
  block_finished_ = true;
  tos_value_.statement_ = new JumpStatement(jump_statement->label_);
}